

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

bool operator==(Entry *lhs,Entry *rhs)

{
  bool bVar1;
  tuple<const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  tuple<const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_28;
  Entry *local_18;
  Entry *rhs_local;
  Entry *lhs_local;
  
  local_18 = rhs;
  rhs_local = lhs;
  std::tie<Date_const,std::__cxx11::string_const>
            ((Date *)&local_28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lhs);
  std::tie<Date_const,std::__cxx11::string_const>
            ((Date *)&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18);
  bVar1 = std::operator==(&local_28,&local_38);
  return bVar1;
}

Assistant:

bool operator==(const Entry &lhs, const Entry &rhs) {
    return tie(lhs.date, lhs.event) == tie(rhs.date, rhs.event);
}